

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O1

void __thiscall
solitaire::events::EventsProcessorTests_startNewGameOnLeftButtonDownEvent_Test::
~EventsProcessorTests_startNewGameOnLeftButtonDownEvent_Test
          (EventsProcessorTests_startNewGameOnLeftButtonDownEvent_Test *this)

{
  EventsProcessorTests::~EventsProcessorTests(&this->super_EventsProcessorTests);
  operator_delete(this,0xf20);
  return;
}

Assistant:

TEST_F(EventsProcessorTests, startNewGameOnLeftButtonDownEvent) {
    expectEvent(mouseLeftButtonDownEvent);
    EXPECT_CALL(contextMock, getNewGameButton()).WillOnce(ReturnRef(buttonMock));
    EXPECT_CALL(buttonMock, collidesWith(mouseLeftButtonDownEvent.position))
        .WillOnce(Return(true));
    EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
    EXPECT_CALL(solitaireMock, startNewGame());
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}